

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O3

bool __thiscall
CBlockPolicyEstimator::_removeTx(CBlockPolicyEstimator *this,uint256 *hash,bool inBlock)

{
  map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  long lVar2;
  iterator iVar3;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
  pVar4;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->mapMemPoolTxs;
  iVar3 = std::
          _Rb_tree<uint256,_std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>,_std::_Select1st<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
          ::find(&this_00->_M_t,hash);
  p_Var1 = &(this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
    TxConfirmStats::removeTx
              ((this->feeStats)._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,iVar3._M_node[2]._M_color
               ,this->nBestSeenHeight,*(uint *)&iVar3._M_node[2].field_0x4,inBlock);
    TxConfirmStats::removeTx
              ((this->shortStats)._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,iVar3._M_node[2]._M_color
               ,this->nBestSeenHeight,*(uint *)&iVar3._M_node[2].field_0x4,inBlock);
    TxConfirmStats::removeTx
              ((this->longStats)._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,iVar3._M_node[2]._M_color
               ,this->nBestSeenHeight,*(uint *)&iVar3._M_node[2].field_0x4,inBlock);
    pVar4 = std::
            _Rb_tree<uint256,_std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>,_std::_Select1st<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
            ::equal_range(&this_00->_M_t,hash);
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>,_std::_Select1st<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (_Rb_tree_header *)iVar3._M_node != p_Var1;
  }
  __stack_chk_fail();
}

Assistant:

bool CBlockPolicyEstimator::_removeTx(const uint256& hash, bool inBlock)
{
    AssertLockHeld(m_cs_fee_estimator);
    std::map<uint256, TxStatsInfo>::iterator pos = mapMemPoolTxs.find(hash);
    if (pos != mapMemPoolTxs.end()) {
        feeStats->removeTx(pos->second.blockHeight, nBestSeenHeight, pos->second.bucketIndex, inBlock);
        shortStats->removeTx(pos->second.blockHeight, nBestSeenHeight, pos->second.bucketIndex, inBlock);
        longStats->removeTx(pos->second.blockHeight, nBestSeenHeight, pos->second.bucketIndex, inBlock);
        mapMemPoolTxs.erase(hash);
        return true;
    } else {
        return false;
    }
}